

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_object.cpp
# Opt level: O0

object_ptr __thiscall mjs::global_object::make_arguments_array(global_object *this)

{
  version vVar1;
  gc_heap *args;
  undefined8 extraout_RDX;
  global_object *in_RSI;
  object_ptr oVar2;
  object local_58;
  undefined1 local_38 [24];
  object_ptr op;
  global_object *this_local;
  
  (*(in_RSI->super_object)._vptr_object[0xb])(local_38 + 0x10);
  args = mjs::object::heap(&in_RSI->super_object);
  vVar1 = language_version(in_RSI);
  if ((int)vVar1 < 2) {
    gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)(local_38 + 0x10));
    mjs::object::class_name(&local_58);
  }
  else {
    (*(in_RSI->super_object)._vptr_object[0x13])(&local_58,in_RSI,"Arguments");
  }
  gc_heap::make<mjs::arguments_array_object,mjs::string,mjs::gc_heap_ptr<mjs::object>&>
            ((gc_heap *)local_38,(string *)args,(gc_heap_ptr<mjs::object> *)&local_58);
  gc_heap_ptr<mjs::object>::gc_heap_ptr<mjs::arguments_array_object,void>
            ((gc_heap_ptr<mjs::object> *)this,(gc_heap_ptr<mjs::arguments_array_object> *)local_38);
  gc_heap_ptr<mjs::arguments_array_object>::~gc_heap_ptr
            ((gc_heap_ptr<mjs::arguments_array_object> *)local_38);
  string::~string((string *)&local_58);
  gc_heap_ptr<mjs::object>::~gc_heap_ptr((gc_heap_ptr<mjs::object> *)(local_38 + 0x10));
  oVar2.super_gc_heap_ptr_untyped._8_8_ = extraout_RDX;
  oVar2.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)this;
  return (object_ptr)oVar2.super_gc_heap_ptr_untyped;
}

Assistant:

object_ptr global_object::make_arguments_array() {
    auto op = object_prototype();
    return heap().make<arguments_array_object>(language_version() >= version::es5 ? common_string("Arguments") : op->class_name(), op);
}